

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

bool __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,
          bool excludeGuardPages)

{
  PageAllocatorBaseCommon *pPVar1;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  HANDLE pVVar7;
  AllocatorType *pAVar8;
  char *pcVar9;
  char *error;
  undefined4 *puVar10;
  undefined8 *in_FS_OFFSET;
  DWORD local_2c [2];
  DWORD oldProtect;
  
  pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar8 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar8 = (AllocatorType *)0x0;
  }
  if ((this->freePageCount != 0) &&
     ((this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount !=
      (ulong)(this->freePageCount + pAVar8[0x2e]))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)*in_FS_OFFSET;
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x111,
                       "(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0)"
                       ,
                       "freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0"
                      );
    if (!bVar4) goto LAB_0025649f;
    *puVar10 = 0;
  }
  bVar4 = SegmentBase<Memory::VirtualAllocWrapper>::Initialize
                    (&this->super_SegmentBase<Memory::VirtualAllocWrapper>,allocFlags,
                     excludeGuardPages);
  if (bVar4) {
    if (this->freePageCount != 0) {
      pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
               allocator;
      pAVar8 = &pPVar1[-1].allocatorType;
      if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
        pAVar8 = (AllocatorType *)0x0;
      }
      pVVar2 = *(HANDLE *)(pAVar8 + 0x4a);
      pVVar7 = GetCurrentProcess();
      if (pVVar2 == pVVar7) {
        pcVar9 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
        uVar5 = GetAvailablePageCount(this);
        BVar6 = VirtualProtect(pcVar9,(ulong)(uVar5 << 0xc),1,local_2c);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)*in_FS_OFFSET;
          *puVar10 = 1;
          error = "((0))";
          pcVar9 = "UNREACHED";
          uVar5 = 0x11c;
LAB_00256478:
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,uVar5,error,pcVar9);
          if (!bVar4) {
LAB_0025649f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar10 = 0;
        }
        else if (local_2c[0] != 4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)*in_FS_OFFSET;
          *puVar10 = 1;
          error = "(oldProtect == 0x04)";
          pcVar9 = "oldProtect == PAGE_READWRITE";
          uVar5 = 0x11f;
          goto LAB_00256478;
        }
        if (BVar6 == 0) goto LAB_00256490;
      }
    }
    bVar4 = true;
  }
  else {
LAB_00256490:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
PageSegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0);
    if (__super::Initialize(allocFlags, excludeGuardPages))
    {
        if (freePageCount != 0)
        {
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(this->address, this->GetAvailablePageCount() * AutoSystemInfo::PageSize, PAGE_NOACCESS, &oldProtect);
                if(vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return false;
                }
                Assert(oldProtect == PAGE_READWRITE);
            }
        }
        return true;
    }
    return false;
}